

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costSecondPartialDerivativeWRTStateSparsity
          (L2NormCost *this,SparsityStructure *stateSparsity)

{
  SparsityStructure *in_RSI;
  CostAttributes *in_stack_ffffffffffffffe8;
  
  CostAttributes::getHessianSparsity(in_stack_ffffffffffffffe8);
  SparsityStructure::operator=(in_RSI,(SparsityStructure *)in_stack_ffffffffffffffe8);
  return true;
}

Assistant:

bool L2NormCost::costSecondPartialDerivativeWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            stateSparsity = m_pimpl->stateCost.getHessianSparsity();
            return true;
        }